

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::AttributeBegin(ParsedScene *this,FileLoc loc)

{
  value_type *in_RDI;
  FileLoc *unaff_retaddr;
  value_type *__x;
  vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_> *this_00;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  char (*in_stack_fffffffffffffff0) [15];
  
  this_00 = (vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
             *)&stack0x00000008;
  if (*(int *)((long)&in_RDI[2].mediumAttributes.field_2 + 0x28) == 2) {
    Error<char_const(&)[15]>(unaff_retaddr,(char *)in_RDI,in_stack_fffffffffffffff0);
  }
  else if (*(int *)((long)&in_RDI[2].mediumAttributes.field_2 + 0x28) == 0) {
    Error<char_const(&)[15]>(unaff_retaddr,(char *)in_RDI,in_stack_fffffffffffffff0);
  }
  else {
    std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ::push_back((vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
                 *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_RDI);
    std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::push_back
              ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)
               CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),(value_type *)in_RDI);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
               (value_type_conflict5 *)in_RDI);
    __x = (value_type *)&in_RDI[3].materialAttributes.nAlloc;
    std::make_pair<char,pbrt::FileLoc&>((char *)this_00,(FileLoc *)__x);
    std::vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>::
    push_back(this_00,__x);
  }
  return;
}

Assistant:

void ParsedScene::AttributeBegin(FileLoc loc) {
    VERIFY_WORLD("AttributeBegin");

    pushedGraphicsStates.push_back(*graphicsState);

    pushedTransforms.push_back(curTransform);
    pushedActiveTransformBits.push_back(activeTransformBits);

    pushStack.push_back(std::make_pair('a', loc));
}